

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint __thiscall ExpressionContext::GetTypeIndex(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  
  uVar1 = 0;
  while( true ) {
    if ((this->types).count == uVar1) {
      __assert_fail("index != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x612,"unsigned int ExpressionContext::GetTypeIndex(TypeBase *)");
    }
    if ((this->types).data[uVar1] == type) break;
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

unsigned ExpressionContext::GetTypeIndex(TypeBase *type)
{
	unsigned index = ~0u;

	for(unsigned i = 0, e = types.count; i < e; i++)
	{
		if(types.data[i] == type)
		{
			index = i;
			break;
		}
	}

	assert(index != ~0u);

	return index;
}